

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_aec.c
# Opt level: O2

int encode_decode_small(test_state *state)

{
  aec_stream_conflict *strm;
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uchar *puVar6;
  char *__s;
  int i;
  ulong uVar7;
  ulong uVar8;
  int i_1;
  ulong uVar9;
  
  strm = (aec_stream_conflict *)state->strm;
  iVar5 = aec_encode_init((aec_stream *)strm);
  if (iVar5 == 0) {
    strm->next_in = state->ubuf;
    strm->avail_in = (long)state->bytes_per_sample;
    strm->avail_out = 1;
    strm->next_out = state->cbuf;
    bVar3 = true;
    uVar7 = 0;
    bVar2 = bVar3;
    bVar4 = bVar3;
    uVar9 = 0;
    while ((bVar2 || bVar4 && (uVar9 < state->cbuf_len))) {
      if ((bVar4) && (strm->avail_in == 0)) {
        uVar7 = uVar7 + (long)state->bytes_per_sample;
        if (uVar7 < state->buf_len) {
          strm->avail_in = (long)state->bytes_per_sample;
          strm->next_in = state->ubuf + uVar7;
          bVar4 = bVar3;
        }
        else {
          bVar4 = false;
        }
      }
      iVar5 = aec_encode((aec_stream *)strm,0);
      if (iVar5 != 0) goto LAB_00104802;
      sVar1 = strm->total_out;
      bVar2 = false;
      if ((sVar1 != uVar9) && (bVar2 = false, uVar9 < state->cbuf_len)) {
        strm->avail_out = 1;
        strm->next_out = state->cbuf + sVar1;
        bVar2 = bVar3;
        uVar9 = sVar1;
      }
    }
    iVar5 = aec_encode((aec_stream *)strm,1);
    if (iVar5 != 0) {
      __s = "Encode failed.";
      goto LAB_00104636;
    }
    aec_encode_end((aec_stream *)strm);
    uVar9 = strm->total_out;
    strm->avail_in = 1;
    strm->next_in = state->cbuf;
    strm->avail_out = (long)state->bytes_per_sample;
    strm->next_out = state->obuf;
    iVar5 = aec_decode_init(strm);
    if (iVar5 == 0) {
      strm->next_in = state->cbuf;
      strm->avail_in = 1;
      strm->avail_out = (long)state->bytes_per_sample;
      puVar6 = state->obuf;
      bVar2 = true;
      uVar8 = 0;
      uVar7 = 0;
      do {
        bVar3 = true;
        strm->next_out = puVar6;
        do {
          if ((!bVar3 && !bVar2) || (state->buf_len <= uVar7)) {
            iVar5 = aec_decode(strm,1);
            if (iVar5 == 0) {
              iVar5 = bcmp(state->ubuf,state->obuf,state->ibuf_len);
              if (iVar5 != 0) {
                printf("\n%s: Uncompressed output differs from input.\n","\x1b[0;31mFAIL\x1b[0m");
                printf("\nuncompressed buf");
                for (uVar7 = 0; uVar7 != 0x50; uVar7 = uVar7 + 1) {
                  if ((uVar7 & 7) == 0) {
                    putchar(10);
                  }
                  printf("%02x ",(ulong)state->ubuf[uVar7]);
                }
                printf("\n\ncompressed buf len %zu",uVar9);
                for (uVar9 = 0; uVar9 != 0x50; uVar9 = uVar9 + 1) {
                  if ((uVar9 & 7) == 0) {
                    putchar(10);
                  }
                  printf("%02x ",(ulong)state->cbuf[uVar9]);
                }
                printf("\n\ndecompressed buf");
                for (uVar9 = 0; uVar9 != 0x50; uVar9 = uVar9 + 1) {
                  if ((uVar9 & 7) == 0) {
                    printf("\n%04i ",uVar9 & 0xffffffff);
                  }
                  printf("%02x ",(ulong)state->obuf[uVar9]);
                }
                putchar(10);
                return 99;
              }
              aec_decode_end(strm);
              return 0;
            }
            goto LAB_00104802;
          }
          if ((bVar2) && (strm->avail_in == 0)) {
            uVar8 = uVar8 + 1;
            if (uVar8 < uVar9) {
              strm->avail_in = 1;
              strm->next_in = state->cbuf + uVar8;
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
          }
          iVar5 = aec_decode(strm,0);
          if (iVar5 != 0) goto LAB_00104802;
          sVar1 = strm->total_out;
          bVar3 = false;
        } while ((sVar1 == uVar7) || (bVar3 = false, state->buf_len <= uVar7));
        strm->avail_out = (long)state->bytes_per_sample;
        puVar6 = state->obuf + sVar1;
        uVar7 = sVar1;
      } while( true );
    }
  }
  __s = "Init failed.";
  goto LAB_00104636;
LAB_00104802:
  __s = "Decode failed.";
LAB_00104636:
  puts(__s);
  return 99;
}

Assistant:

int encode_decode_small(struct test_state *state)
{
    size_t compressed_size;
    size_t n_in, avail_in, avail_out, total_out;
    struct aec_stream *strm = state->strm;

    int status = aec_encode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    n_in = 0;
    avail_in = 1;
    avail_out = 1;
    total_out = 0;
    strm->next_in = state->ubuf;
    strm->avail_in = state->bytes_per_sample;
    strm->avail_out = 1;
    strm->next_out = state->cbuf;

    while ((avail_in || avail_out) && total_out < state->cbuf_len) {
        if (strm->avail_in == 0 && avail_in) {
            n_in += state->bytes_per_sample;
            if (n_in < state->buf_len) {
                strm->avail_in = state->bytes_per_sample;
                strm->next_in = state->ubuf + n_in;
            } else {
                avail_in = 0;
            }
        }

        status = aec_encode(strm, AEC_NO_FLUSH);
        if (status != AEC_OK) {
            printf("Decode failed.\n");
            return 99;
        }

        if (strm->total_out - total_out > 0
            && total_out < state->cbuf_len) {
            total_out = strm->total_out;
            strm->avail_out = 1;
            strm->next_out = state->cbuf + total_out;
            avail_out = 1;
        } else {
            avail_out = 0;
        }
    }

    status = aec_encode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Encode failed.\n");
        return 99;
    }

    aec_encode_end(strm);

    compressed_size = strm->total_out;

    strm->avail_in = 1;
    strm->next_in = state->cbuf;

    strm->avail_out = state->bytes_per_sample;
    strm->next_out = state->obuf;

    status = aec_decode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    n_in = 0;
    avail_in = 1;
    avail_out = 1;
    total_out = 0;
    strm->next_in = state->cbuf;
    strm->avail_in = 1;
    strm->avail_out = state->bytes_per_sample;
    strm->next_out = state->obuf;

    while ((avail_in || avail_out) && total_out < state->buf_len) {
        if (strm->avail_in == 0 && avail_in) {
            n_in++;
            if (n_in < compressed_size) {
                strm->avail_in = 1;
                strm->next_in = state->cbuf + n_in;
            } else {
                avail_in = 0;
            }
        }

        status = aec_decode(strm, AEC_NO_FLUSH);
        if (status != AEC_OK) {
            printf("Decode failed.\n");
            return 99;
        }

        if (strm->total_out - total_out > 0
            && total_out < state->buf_len) {
            total_out = strm->total_out;
            strm->avail_out = state->bytes_per_sample;
            strm->next_out = state->obuf + total_out;
            avail_out = 1;
        } else {
            avail_out = 0;
        }
    }

    status = aec_decode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Decode failed.\n");
        return 99;
    }

    if (memcmp(state->ubuf, state->obuf, state->ibuf_len)) {
        printf("\n%s: Uncompressed output differs from input.\n", CHECK_FAIL);

        printf("\nuncompressed buf");
        for (int i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->ubuf[i]);
        }
        printf("\n\ncompressed buf len %zu", compressed_size);
        for (int i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->cbuf[i]);
        }
        printf("\n\ndecompressed buf");
        for (int i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n%04i ", i);
            printf("%02x ", state->obuf[i]);
        }
        printf("\n");
        return 99;
    }
    aec_decode_end(strm);
    return 0;
}